

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  void *unaff_RBX;
  void *pvVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pvVar3 = opendir_req.ptr;
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015af21;
    if (opendir_req.result != 0) goto LAB_0015af26;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015af2b;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar3 + 8) = 1;
    req = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_readdir(req,&readdir_req,pvVar3,non_empty_readdir_cb);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&opendir_req);
      non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    non_empty_opendir_cb_cold_1();
LAB_0015af21:
    non_empty_opendir_cb_cold_2();
LAB_0015af26:
    non_empty_opendir_cb_cold_3();
    pvVar3 = unaff_RBX;
LAB_0015af2b:
    non_empty_opendir_cb_cold_5();
  }
  non_empty_opendir_cb_cold_4();
  pvVar1 = readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type != UV_FS_READDIR) goto LAB_0015af91;
    if (readdir_req.result != 0) goto LAB_0015af96;
    uv_fs_req_cleanup(&readdir_req);
    req = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_closedir(req,&closedir_req,pvVar1,empty_closedir_cb,in_R8,in_R9,pvVar3);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    empty_readdir_cb_cold_1();
LAB_0015af91:
    empty_readdir_cb_cold_2();
LAB_0015af96:
    empty_readdir_cb_cold_3();
  }
  empty_readdir_cb_cold_4();
  if (req == &closedir_req) {
    if (closedir_req.fs_type == UV_FS_CLOSEDIR) {
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0015afdd;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0015afdd:
  empty_closedir_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(req,0);
  return;
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT(r == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}